

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_inverse(quaternion *self)

{
  short sVar1;
  float f1;
  float norm;
  quaternion *self_local;
  
  f1 = quaternion_norm(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    quaternion_conjugate(self);
    sVar1 = scalar_equalsf(f1,1.0);
    if (sVar1 == 0) {
      (self->field_0).q[0] = (self->field_0).q[0] / f1;
      (self->field_0).q[1] = (self->field_0).q[1] / f1;
      (self->field_0).q[2] = (self->field_0).q[2] / f1;
      (self->field_0).q[3] = (self->field_0).q[3] / f1;
    }
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_inverse(struct quaternion *self)
{
	HYP_FLOAT norm;

	norm = quaternion_norm(self);

	if (scalar_equalsf(norm, 0.0f)) {
		/* avoid divide by zero */
		return self;
	}

	quaternion_conjugate(self);

	if (scalar_equalsf(norm, 1.0f)) {
		/* we're done */
		return self;
	}

	self->x /= norm;
	self->y /= norm;
	self->z /= norm;
	self->w /= norm;

	return self;
}